

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

timestamp_t
duckdb::TimeBucket::WidthConvertibleToMicrosCommon
          (int64_t bucket_width_micros,int64_t ts_micros,int64_t origin_micros)

{
  long lVar1;
  long lVar2;
  timestamp_t tVar3;
  long in_RDX;
  long in_RDI;
  int64_t result_micros;
  long in_stack_00000088;
  long in_stack_00000090;
  
  lVar1 = SubtractOperatorOverflowCheck::Operation<long,long,long>
                    (in_stack_00000090,in_stack_00000088);
  lVar2 = (lVar1 / in_RDI) * in_RDI;
  if ((lVar1 < 0) && (lVar1 % in_RDI != 0)) {
    lVar2 = SubtractOperatorOverflowCheck::Operation<long,long,long>
                      (in_stack_00000090,in_stack_00000088);
  }
  tVar3 = Timestamp::FromEpochMicroSeconds(in_RDX % in_RDI + lVar2);
  return (timestamp_t)tVar3.value;
}

Assistant:

static inline timestamp_t WidthConvertibleToMicrosCommon(int64_t bucket_width_micros, int64_t ts_micros,
	                                                         int64_t origin_micros) {
		origin_micros %= bucket_width_micros;
		ts_micros = SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(ts_micros, origin_micros);

		int64_t result_micros = (ts_micros / bucket_width_micros) * bucket_width_micros;
		if (ts_micros < 0 && ts_micros % bucket_width_micros != 0) {
			result_micros =
			    SubtractOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(result_micros, bucket_width_micros);
		}
		result_micros += origin_micros;

		return Timestamp::FromEpochMicroSeconds(result_micros);
	}